

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

XmlWriter * __thiscall Catch::XmlWriter::writeBlankLine(XmlWriter *this)

{
  if (this->m_tagIsOpen == true) {
    std::__ostream_insert<char,std::char_traits<char>>(this->m_os,">\n",2);
    this->m_tagIsOpen = false;
  }
  std::__ostream_insert<char,std::char_traits<char>>(this->m_os,"\n",1);
  return this;
}

Assistant:

XmlWriter& writeBlankLine() {
            ensureTagClosed();
            stream() << "\n";
            return *this;
        }